

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

eStorageDeviceError
ON_BinaryArchive::StorageDeviceErrorFromUnsigned(uint storage_device_error_as_unsigned)

{
  undefined8 in_R8;
  undefined8 in_R9;
  
  if ((storage_device_error_as_unsigned + 0xf < 0x10) &&
     ((0xc183U >> (storage_device_error_as_unsigned + 0xf & 0x1f) & 1) != 0)) {
    return storage_device_error_as_unsigned;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,0x231,"","Invalid storage_device_error_as_unsigned parmeter.",in_R8,in_R9,
             storage_device_error_as_unsigned);
  return UnknownDeviceError;
}

Assistant:

ON_BinaryArchive::eStorageDeviceError ON_BinaryArchive::StorageDeviceErrorFromUnsigned(
  unsigned int storage_device_error_as_unsigned
  )
{
  switch (storage_device_error_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::None);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::WriteFailed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringWriting);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::ReadFailed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringReading);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::UnknownDeviceError);
  }

  ON_ERROR("Invalid storage_device_error_as_unsigned parmeter.");
  return ON_BinaryArchive::eStorageDeviceError::UnknownDeviceError;
}